

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::GPUShaderFP64Test2::iterate(GPUShaderFP64Test2 *this)

{
  bool bVar1;
  shaderStage *psVar2;
  NotSupportedError *this_00;
  pointer puVar3;
  char *description;
  byte bVar4;
  qpTestResult testResult;
  TestContext *this_01;
  pointer uniform_type;
  shaderStage *psVar5;
  string local_40;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_gpu_shader_fp64");
  if (!bVar1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"GL_ARB_gpu_shader_fp64 is not supported","");
    tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  testInit(this);
  prepareShaderStages(this);
  prepareUniformTypes(this);
  psVar5 = (this->m_shader_stages).
           super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->m_shader_stages).
           super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar2 != psVar5) {
    puVar3 = (this->m_uniform_types).
             super__Vector_base<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = 1;
    do {
      uniform_type = (this->m_uniform_types).
                     super__Vector_base<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if (puVar3 != uniform_type) {
        do {
          bVar1 = test(this,*psVar5,uniform_type);
          bVar4 = bVar4 & bVar1;
          puVar3 = uniform_type + 1;
          uniform_type = puVar3;
        } while (puVar3 != (this->m_uniform_types).
                           super__Vector_base<gl4cts::GPUShaderFP64Test2::uniformTypeDetails,_std::allocator<gl4cts::GPUShaderFP64Test2::uniformTypeDetails>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        psVar2 = (this->m_shader_stages).
                 super__Vector_base<gl4cts::GPUShaderFP64Test2::shaderStage,_std::allocator<gl4cts::GPUShaderFP64Test2::shaderStage>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      psVar5 = psVar5 + 1;
    } while (psVar2 != psVar5);
    if (bVar4 == 0) {
      this_01 = ((this->super_TestCase).m_context)->m_testCtx;
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_009200bc;
    }
  }
  this_01 = ((this->super_TestCase).m_context)->m_testCtx;
  description = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_009200bc:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GPUShaderFP64Test2::iterate()
{
	bool result = true;

	/* Check if extension is supported */
	if (false == m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader_fp64"))
	{
		throw tcu::NotSupportedError("GL_ARB_gpu_shader_fp64 is not supported");
	}

	/* Initialize test */
	testInit();

	prepareShaderStages();
	prepareUniformTypes();

	/* For all shaders and uniform type combinations */
	for (std::vector<shaderStage>::const_iterator shader_stage = m_shader_stages.begin();
		 m_shader_stages.end() != shader_stage; ++shader_stage)
	{
		for (std::vector<uniformTypeDetails>::const_iterator uniform_type = m_uniform_types.begin();
			 m_uniform_types.end() != uniform_type; ++uniform_type)
		{
			/* Execute test */
			if (false == test(*shader_stage, *uniform_type))
			{
				result = false;
			}
		}
	}

	/* Set result */
	if (true == result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}